

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  char *pcVar4;
  string *psVar5;
  Version *version;
  element_type *peVar6;
  Colour local_11;
  ConsoleReporter *pCStack_10;
  Colour colour;
  ConsoleReporter *this_local;
  
  pCStack_10 = this;
  poVar3 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,'\n');
  pcVar4 = getLineOfChars<(char)126>();
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::operator<<(poVar3,'\n');
  Colour::Colour(&local_11,FileName);
  poVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  psVar5 = (string *)
           Option<Catch::TestRunInfo>::operator->
                     (&(this->super_StreamingReporterBase<Catch::ConsoleReporter>).
                       currentTestRunInfo.super_Option<Catch::TestRunInfo>);
  poVar3 = std::operator<<(poVar3,psVar5);
  poVar3 = std::operator<<(poVar3," is a Catch v");
  version = libraryVersion();
  poVar3 = Catch::operator<<(poVar3,version);
  poVar3 = std::operator<<(poVar3," host application.\n");
  std::operator<<(poVar3,"Run with -? for options\n\n");
  peVar6 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config);
  iVar1 = (*(peVar6->super_NonCopyable)._vptr_NonCopyable[0x11])();
  if (iVar1 != 0) {
    poVar3 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                             "Randomness seeded to: ");
    peVar6 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config);
    uVar2 = (*(peVar6->super_NonCopyable)._vptr_NonCopyable[0x11])();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar2);
    std::operator<<(poVar3,"\n\n");
  }
  (this->super_StreamingReporterBase<Catch::ConsoleReporter>).currentTestRunInfo.used = true;
  Colour::~Colour(&local_11);
  return;
}

Assistant:

void ConsoleReporter::lazyPrintRunInfo() {
    stream << '\n' << getLineOfChars<'~'>() << '\n';
    Colour colour(Colour::SecondaryText);
    stream << currentTestRunInfo->name
        << " is a Catch v" << libraryVersion() << " host application.\n"
        << "Run with -? for options\n\n";

    if (m_config->rngSeed() != 0)
        stream << "Randomness seeded to: " << m_config->rngSeed() << "\n\n";

    currentTestRunInfo.used = true;
}